

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

void __thiscall tst_InsertProxyModel::testDataForCorner(tst_InsertProxyModel *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  QAbstractItemModel *parent;
  ModelTest *this_00;
  ItemDataRole local_470 [2];
  qsizetype local_468;
  QList<QVariant> local_460;
  QVariant local_448;
  QList<int> local_428;
  qint32 local_40c;
  qsizetype local_408;
  qint32 local_3fc;
  qsizetype local_3f8;
  QVariant local_3f0;
  QModelIndex local_3d0;
  QModelIndex local_3b8;
  QModelIndex local_3a0;
  QModelIndex local_388;
  QVariant local_370;
  QVariant local_350;
  QModelIndex local_330;
  QModelIndex local_318;
  QModelIndex local_300;
  QModelIndex local_2e8;
  QVariant local_2d0;
  QVariant local_2b0;
  ItemDataRole local_28c [3];
  qsizetype local_280;
  QList<QVariant> local_278;
  QVariant local_260;
  undefined1 local_240 [8];
  QList<int> roles;
  qsizetype local_220;
  qint32 local_214;
  qsizetype local_210;
  QVariant local_208;
  QModelIndex local_1e8;
  QModelIndex local_1d0;
  QModelIndex local_1b8;
  QModelIndex local_1a0;
  QVariant local_188;
  QVariant local_168;
  Int local_148;
  undefined4 local_144;
  undefined1 local_140 [8];
  QSignalSpy cornerDataChangeSpy;
  QSignalSpy cornerChangeSpy;
  InsertProxyModel local_30 [8];
  InsertProxyModel proxyModel;
  QAbstractItemModel *baseModel;
  tst_InsertProxyModel *this_local;
  
  parent = createListModel(&this->super_QObject);
  InsertProxyModel::InsertProxyModel(local_30,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)local_30,(QObject *)parent);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)&cornerDataChangeSpy.m_waiting,(QObject *)local_30,
             "2dataForCornerChanged(QVector<int>)");
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_140,(QObject *)local_30,
             "2dataChanged(QModelIndex, QModelIndex, QVector<int>)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)&cornerDataChangeSpy.m_waiting);
  bVar2 = QTest::qVerify(bVar1,"cornerChangeSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x201);
  if ((bVar2 & 1) == 0) {
    local_144 = 1;
  }
  else {
    bVar1 = QSignalSpy::isValid((QSignalSpy *)local_140);
    bVar2 = QTest::qVerify(bVar1,"cornerDataChangeSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x202);
    if ((bVar2 & 1) == 0) {
      local_144 = 1;
    }
    else {
      local_148 = (Int)operator|(InsertColumn,InsertRow);
      InsertProxyModel::setInsertDirection((QFlags_conflict1 *)local_30);
      InsertProxyModel::setSourceModel((QAbstractItemModel *)local_30);
      QVariant::QVariant(&local_168,0x1639);
      InsertProxyModel::setDataForCorner((QVariant *)local_30,(int)&local_168);
      QVariant::~QVariant(&local_168);
      QModelIndex::QModelIndex(&local_1b8);
      uVar3 = (**(code **)(*(long *)parent + 0x78))(parent,&local_1b8);
      QModelIndex::QModelIndex(&local_1d0);
      (**(code **)(*(long *)parent + 0x80))(parent,&local_1d0);
      QModelIndex::QModelIndex(&local_1e8);
      InsertProxyModel::index((int)&local_1a0,(int)local_30,(QModelIndex *)(ulong)uVar3);
      QModelIndex::data(&local_188,&local_1a0,0);
      iVar4 = QVariant::toInt((bool *)&local_188);
      bVar2 = QTest::qCompare(iVar4,0x1639,
                              "proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt()"
                              ,"5689",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                              ,0x206);
      QVariant::~QVariant(&local_188);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        InsertProxyModel::dataForCorner((int)&local_208);
        iVar4 = QVariant::toInt((bool *)&local_208);
        bVar2 = QTest::qCompare(iVar4,0x1639,"proxyModel.dataForCorner().toInt()","5689",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                ,0x207);
        QVariant::~QVariant(&local_208);
        if (((bVar2 ^ 0xff) & 1) == 0) {
          local_210 = QList<QList<QVariant>_>::count
                                ((QList<QList<QVariant>_> *)&cornerChangeSpy.field_0x8);
          local_214 = 1;
          bVar1 = QTest::qCompare<long_long,int>
                            (&local_210,&local_214,"cornerChangeSpy.count()","1",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x208);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_220 = QList<QList<QVariant>_>::count
                                  ((QList<QList<QVariant>_> *)&cornerDataChangeSpy.field_0x8);
            roles.d.size._4_4_ = 1;
            bVar1 = QTest::qCompare<long_long,int>
                              (&local_220,(qint32 *)((long)&roles.d.size + 4),
                               "cornerDataChangeSpy.count()","1",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                               ,0x209);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              QList<QList<QVariant>_>::value
                        (&local_278,(QList<QList<QVariant>_> *)&cornerChangeSpy.field_0x8,0);
              QList<QVariant>::value(&local_260,&local_278,0);
              QVariant::value<QList<int>>((QList<int> *)local_240,&local_260);
              QVariant::~QVariant(&local_260);
              QList<QVariant>::~QList(&local_278);
              QList<QList<QVariant>_>::clear((QList<QList<QVariant>_> *)&cornerChangeSpy.field_0x8);
              QList<QList<QVariant>_>::clear
                        ((QList<QList<QVariant>_> *)&cornerDataChangeSpy.field_0x8);
              local_280 = QList<int>::size((QList<int> *)local_240);
              local_28c[2] = 2;
              bVar1 = QTest::qCompare<long_long,int>
                                (&local_280,(qint32 *)(local_28c + 2),"roles.size()","2",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                 ,0x20d);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                local_28c[1] = 2;
                bVar1 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                  ((QListSpecialMethodsBase<int> *)local_240,local_28c + 1);
                bVar2 = QTest::qVerify(bVar1,"roles.contains(Qt::EditRole)","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                       ,0x20e);
                if (((bVar2 ^ 0xff) & 1) == 0) {
                  local_28c[0] = DisplayRole;
                  bVar1 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                    ((QListSpecialMethodsBase<int> *)local_240,local_28c);
                  bVar2 = QTest::qVerify(bVar1,"roles.contains(Qt::DisplayRole)","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                         ,0x20f);
                  if (((bVar2 ^ 0xff) & 1) == 0) {
                    InsertProxyModel::setMergeDisplayEdit(SUB81(local_30,0));
                    QVariant::QVariant(&local_2b0,0x2225);
                    InsertProxyModel::setDataForCorner((QVariant *)local_30,(int)&local_2b0);
                    QVariant::~QVariant(&local_2b0);
                    QModelIndex::QModelIndex(&local_300);
                    uVar3 = (**(code **)(*(long *)parent + 0x78))(parent,&local_300);
                    QModelIndex::QModelIndex(&local_318);
                    (**(code **)(*(long *)parent + 0x80))(parent,&local_318);
                    QModelIndex::QModelIndex(&local_330);
                    InsertProxyModel::index
                              ((int)&local_2e8,(int)local_30,(QModelIndex *)(ulong)uVar3);
                    QModelIndex::data(&local_2d0,&local_2e8,0);
                    iVar4 = QVariant::toInt((bool *)&local_2d0);
                    bVar2 = QTest::qCompare(iVar4,0x1639,
                                            "proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt()"
                                            ,"5689",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                            ,0x212);
                    QVariant::~QVariant(&local_2d0);
                    if (((bVar2 ^ 0xff) & 1) == 0) {
                      InsertProxyModel::dataForCorner((int)&local_350);
                      iVar4 = QVariant::toInt((bool *)&local_350);
                      bVar2 = QTest::qCompare(iVar4,0x1639,"proxyModel.dataForCorner().toInt()",
                                              "5689",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                              ,0x213);
                      QVariant::~QVariant(&local_350);
                      if (((bVar2 ^ 0xff) & 1) == 0) {
                        QModelIndex::QModelIndex(&local_3a0);
                        uVar3 = (**(code **)(*(long *)parent + 0x78))(parent,&local_3a0);
                        QModelIndex::QModelIndex(&local_3b8);
                        (**(code **)(*(long *)parent + 0x80))(parent,&local_3b8);
                        QModelIndex::QModelIndex(&local_3d0);
                        InsertProxyModel::index
                                  ((int)&local_388,(int)local_30,(QModelIndex *)(ulong)uVar3);
                        QModelIndex::data(&local_370,&local_388,2);
                        iVar4 = QVariant::toInt((bool *)&local_370);
                        bVar2 = QTest::qCompare(iVar4,0x2225,
                                                "proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data(Qt::EditRole).toInt()"
                                                ,"8741",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                ,0x214);
                        QVariant::~QVariant(&local_370);
                        if (((bVar2 ^ 0xff) & 1) == 0) {
                          InsertProxyModel::dataForCorner((int)&local_3f0);
                          iVar4 = QVariant::toInt((bool *)&local_3f0);
                          bVar2 = QTest::qCompare(iVar4,0x2225,
                                                  "proxyModel.dataForCorner(Qt::EditRole).toInt()",
                                                  "8741",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x215);
                          QVariant::~QVariant(&local_3f0);
                          if (((bVar2 ^ 0xff) & 1) == 0) {
                            local_3f8 = QList<QList<QVariant>_>::count
                                                  ((QList<QList<QVariant>_> *)
                                                   &cornerChangeSpy.field_0x8);
                            local_3fc = 1;
                            bVar1 = QTest::qCompare<long_long,int>
                                              (&local_3f8,&local_3fc,"cornerChangeSpy.count()","1",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                               ,0x216);
                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                              local_408 = QList<QList<QVariant>_>::count
                                                    ((QList<QList<QVariant>_> *)
                                                     &cornerDataChangeSpy.field_0x8);
                              local_40c = 1;
                              bVar1 = QTest::qCompare<long_long,int>
                                                (&local_408,&local_40c,"cornerDataChangeSpy.count()"
                                                 ,"1",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                 ,0x217);
                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                QList<QList<QVariant>_>::value
                                          (&local_460,
                                           (QList<QList<QVariant>_> *)&cornerChangeSpy.field_0x8,0);
                                QList<QVariant>::value(&local_448,&local_460,0);
                                QVariant::value<QList<int>>(&local_428,&local_448);
                                QList<int>::operator=((QList<int> *)local_240,&local_428);
                                QList<int>::~QList(&local_428);
                                QVariant::~QVariant(&local_448);
                                QList<QVariant>::~QList(&local_460);
                                QList<QList<QVariant>_>::clear
                                          ((QList<QList<QVariant>_> *)&cornerChangeSpy.field_0x8);
                                QList<QList<QVariant>_>::clear
                                          ((QList<QList<QVariant>_> *)&cornerDataChangeSpy.field_0x8
                                          );
                                local_468 = QList<int>::size((QList<int> *)local_240);
                                local_470[1] = 1;
                                bVar1 = QTest::qCompare<long_long,int>
                                                  (&local_468,(qint32 *)(local_470 + 1),
                                                   "roles.size()","1",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x21b);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  local_470[0] = EditRole;
                                  bVar1 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                                    ((QListSpecialMethodsBase<int> *)local_240,
                                                     local_470);
                                  bVar2 = QTest::qVerify(bVar1,"roles.contains(Qt::EditRole)","",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x21c);
                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                    QObject::deleteLater();
                                    local_144 = 0;
                                  }
                                  else {
                                    local_144 = 1;
                                  }
                                }
                                else {
                                  local_144 = 1;
                                }
                              }
                              else {
                                local_144 = 1;
                              }
                            }
                            else {
                              local_144 = 1;
                            }
                          }
                          else {
                            local_144 = 1;
                          }
                        }
                        else {
                          local_144 = 1;
                        }
                      }
                      else {
                        local_144 = 1;
                      }
                    }
                    else {
                      local_144 = 1;
                    }
                  }
                  else {
                    local_144 = 1;
                  }
                }
                else {
                  local_144 = 1;
                }
              }
              else {
                local_144 = 1;
              }
              QList<int>::~QList((QList<int> *)local_240);
            }
            else {
              local_144 = 1;
            }
          }
          else {
            local_144 = 1;
          }
        }
        else {
          local_144 = 1;
        }
      }
      else {
        local_144 = 1;
      }
    }
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_140);
  QSignalSpy::~QSignalSpy((QSignalSpy *)&cornerDataChangeSpy.m_waiting);
  InsertProxyModel::~InsertProxyModel(local_30);
  return;
}

Assistant:

void tst_InsertProxyModel::testDataForCorner()
{
    QAbstractItemModel *const baseModel = createListModel(this);
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    QSignalSpy cornerChangeSpy(&proxyModel, SIGNAL(dataForCornerChanged(QVector<int>)));
    QSignalSpy cornerDataChangeSpy(&proxyModel, SIGNAL(dataChanged(QModelIndex, QModelIndex, QVector<int>)));
    QVERIFY(cornerChangeSpy.isValid());
    QVERIFY(cornerDataChangeSpy.isValid());
    proxyModel.setInsertDirection(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow);
    proxyModel.setSourceModel(baseModel);
    proxyModel.setDataForCorner(5689);
    QCOMPARE(proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt(), 5689);
    QCOMPARE(proxyModel.dataForCorner().toInt(), 5689);
    QCOMPARE(cornerChangeSpy.count(), 1);
    QCOMPARE(cornerDataChangeSpy.count(), 1);
    auto roles = cornerChangeSpy.value(0).value(0).value<QVector<int>>();
    cornerChangeSpy.clear();
    cornerDataChangeSpy.clear();
    QCOMPARE(roles.size(), 2);
    QVERIFY(roles.contains(Qt::EditRole));
    QVERIFY(roles.contains(Qt::DisplayRole));
    proxyModel.setMergeDisplayEdit(false);
    proxyModel.setDataForCorner(8741);
    QCOMPARE(proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt(), 5689);
    QCOMPARE(proxyModel.dataForCorner().toInt(), 5689);
    QCOMPARE(proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data(Qt::EditRole).toInt(), 8741);
    QCOMPARE(proxyModel.dataForCorner(Qt::EditRole).toInt(), 8741);
    QCOMPARE(cornerChangeSpy.count(), 1);
    QCOMPARE(cornerDataChangeSpy.count(), 1);
    roles = cornerChangeSpy.value(0).value(0).value<QVector<int>>();
    cornerChangeSpy.clear();
    cornerDataChangeSpy.clear();
    QCOMPARE(roles.size(), 1);
    QVERIFY(roles.contains(Qt::EditRole));
    baseModel->deleteLater();
}